

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O0

void print_helper2(size_t *i)

{
  size_t *i_local;
  
  if (*i == 0) {
    std::operator<<((ostream *)&std::cout,"|  Cost  ");
  }
  if (*i == 1) {
    std::operator<<((ostream *)&std::cout,"|  Exp   ");
  }
  if (*i == 2) {
    std::operator<<((ostream *)&std::cout,"|  Gas   ");
  }
  if (*i == 3) {
    std::operator<<((ostream *)&std::cout,"|  Comf  ");
  }
  return;
}

Assistant:

void print_helper2(size_t &i) {
    if (i == 0)
        std::cout << "|  Cost  ";
    if (i == 1)
        std::cout << "|  Exp   ";
    if (i == 2)
        std::cout << "|  Gas   ";
    if (i == 3)
        std::cout << "|  Comf  ";

}